

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O0

Optional<unsigned_int> __thiscall
llvm::MCRegisterInfo::getLLVMRegNum(MCRegisterInfo *this,uint RegNum,bool isEH)

{
  DwarfLLVMRegPair *pDVar1;
  uint local_54;
  DwarfLLVMRegPair *local_50;
  DwarfLLVMRegPair *I;
  undefined4 local_30;
  DwarfLLVMRegPair Key;
  uint Size;
  DwarfLLVMRegPair *M;
  bool isEH_local;
  uint RegNum_local;
  MCRegisterInfo *this_local;
  
  if (isEH) {
    local_50 = this->EHDwarf2LRegs;
  }
  else {
    local_50 = this->Dwarf2LRegs;
  }
  stack0xffffffffffffffd8 = local_50;
  if (isEH) {
    local_54 = this->EHDwarf2LRegsSize;
  }
  else {
    local_54 = this->Dwarf2LRegsSize;
  }
  Key.FromReg = local_54;
  if (local_50 == (DwarfLLVMRegPair *)0x0) {
    Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&this_local,None);
  }
  else {
    local_30 = 0;
    I._4_4_ = RegNum;
    pDVar1 = std::
             lower_bound<llvm::MCRegisterInfo::DwarfLLVMRegPair_const*,llvm::MCRegisterInfo::DwarfLLVMRegPair>
                       (local_50,local_50 + local_54,(DwarfLLVMRegPair *)((long)&I + 4));
    if ((pDVar1 == stack0xffffffffffffffd8 + Key.FromReg) || (pDVar1->FromReg != RegNum)) {
      Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&this_local,None);
    }
    else {
      Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&this_local,&pDVar1->ToReg);
    }
  }
  return (Optional<unsigned_int>)(OptionalStorage<unsigned_int,_true>)this_local;
}

Assistant:

Optional<unsigned> MCRegisterInfo::getLLVMRegNum(unsigned RegNum,
                                                 bool isEH) const {
  const DwarfLLVMRegPair *M = isEH ? EHDwarf2LRegs : Dwarf2LRegs;
  unsigned Size = isEH ? EHDwarf2LRegsSize : Dwarf2LRegsSize;

  if (!M)
    return None;
  DwarfLLVMRegPair Key = { RegNum, 0 };
  const DwarfLLVMRegPair *I = std::lower_bound(M, M+Size, Key);
  if (I != M + Size && I->FromReg == RegNum)
    return I->ToReg;
  return None;
}